

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

double __thiscall cnn::expr::exp(expr *this,double __x)

{
  initializer_list<cnn::VariableIndex> *arguments;
  undefined8 *in_RSI;
  double extraout_XMM0_Qa;
  undefined4 local_24;
  undefined4 *local_20;
  undefined8 local_18;
  
  arguments = (initializer_list<cnn::VariableIndex> *)*in_RSI;
  local_24 = *(undefined4 *)(in_RSI + 1);
  local_20 = &local_24;
  local_18 = 1;
  ComputationGraph::add_function<cnn::Exp>((ComputationGraph *)(this + 8),arguments);
  *(initializer_list<cnn::VariableIndex> **)this = arguments;
  return extraout_XMM0_Qa;
}

Assistant:

Expression exp(const Expression& x) { return Expression(x.pg, x.pg->add_function<Exp>({x.i})); }